

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.cpp
# Opt level: O2

int __thiscall llvm::MCRegisterInfo::getSEHRegNum(MCRegisterInfo *this,MCRegister RegNum)

{
  int *piVar1;
  const_iterator cVar2;
  uint local_1c [2];
  MCRegister RegNum_local;
  
  local_1c[0] = RegNum.Reg;
  cVar2 = DenseMapBase<llvm::DenseMap<llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>,_llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>
          ::find((DenseMapBase<llvm::DenseMap<llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>,_llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>
                  *)&this->L2SEHRegs,(const_arg_type_t<llvm::MCRegister>)local_1c);
  piVar1 = &((cVar2.Ptr)->super_pair<llvm::MCRegister,_int>).second;
  if (cVar2.Ptr == (pointer)((ulong)*(uint *)&this->field_0xb0 * 8 + *(long *)&this->L2SEHRegs)) {
    piVar1 = (int *)local_1c;
  }
  return *piVar1;
}

Assistant:

int MCRegisterInfo::getSEHRegNum(MCRegister RegNum) const {
  const DenseMap<MCRegister, int>::const_iterator I = L2SEHRegs.find(RegNum);
  if (I == L2SEHRegs.end()) return (int)RegNum;
  return I->second;
}